

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O3

int ptls_base64_encode(uint8_t *data,size_t data_len,char *ptls_base64_text)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  int i;
  long lVar6;
  size_t sVar7;
  uint local_18 [4];
  
  if (data_len < 3) {
    uVar1 = 0;
    lVar4 = 0;
    sVar7 = data_len;
  }
  else {
    lVar4 = 0;
    uVar1 = 0;
    pcVar5 = ptls_base64_text;
    do {
      local_18[0] = (uint)(data[lVar4] >> 2);
      local_18[1] = (uint)(data[lVar4 + 1] >> 4) | (data[lVar4] & 3) << 4;
      local_18[2] = (uint)(data[lVar4 + 2] >> 6) + (data[lVar4 + 1] & 0xf) * 4;
      local_18[3] = data[lVar4 + 2] & 0x3f;
      lVar6 = 0;
      do {
        pcVar5[lVar6] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(int)local_18[lVar6]];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar4 = lVar4 + 3;
      uVar1 = uVar1 + 4;
      sVar7 = data_len - lVar4;
      pcVar5 = pcVar5 + 4;
    } while (2 < sVar7);
  }
  if (sVar7 == 2) {
    ptls_base64_text[uVar1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[data[lVar4] >> 2];
    ptls_base64_text[(ulong)uVar1 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(data[lVar4 + 1] >> 4) | (data[lVar4] & 3) << 4];
    cVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
            [(ulong)(data[lVar4 + 1] & 0xf) * 4];
  }
  else {
    uVar2 = uVar1;
    if (sVar7 != 1) goto LAB_0011438c;
    ptls_base64_text[uVar1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[data[lVar4] >> 2];
    ptls_base64_text[(ulong)uVar1 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(data[lVar4] & 3) << 4];
    cVar3 = '=';
  }
  ptls_base64_text[(ulong)uVar1 + 2] = cVar3;
  uVar2 = uVar1 + 4;
  ptls_base64_text[(ulong)uVar1 + 3] = '=';
LAB_0011438c:
  ptls_base64_text[(int)uVar2] = '\0';
  return uVar2 + 1;
}

Assistant:

int ptls_base64_encode(const uint8_t *data, size_t data_len, char *ptls_base64_text)
{
    int l = 0;
    int lt = 0;

    while ((data_len - l) >= 3) {
        ptls_base64_cell(data + l, ptls_base64_text + lt);
        l += 3;
        lt += 4;
    }

    switch (data_len - l) {
    case 0:
        break;
    case 1:
        ptls_base64_text[lt++] = ptls_base64_alphabet[data[l] >> 2];
        ptls_base64_text[lt++] = ptls_base64_alphabet[(data[l] & 3) << 4];
        ptls_base64_text[lt++] = '=';
        ptls_base64_text[lt++] = '=';
        break;
    case 2:
        ptls_base64_text[lt++] = ptls_base64_alphabet[data[l] >> 2];
        ptls_base64_text[lt++] = ptls_base64_alphabet[((data[l] & 3) << 4) | (data[l + 1] >> 4)];
        ptls_base64_text[lt++] = ptls_base64_alphabet[((data[l + 1] & 15) << 2)];
        ptls_base64_text[lt++] = '=';
        break;
    default:
        break;
    }
    ptls_base64_text[lt++] = 0;

    return lt;
}